

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifticdf.c
# Opt level: O1

double bfrac(double *a,double *b,double *x,double *y,double *lambda,double *eps)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  
  dVar2 = brcomp(a,b,x,y);
  dVar4 = 0.0;
  if ((dVar2 != 0.0) || (NAN(dVar2))) {
    dVar3 = *lambda + 1.0;
    dVar1 = *a;
    dVar10 = 1.0 / dVar1 + 1.0;
    bfrac::s = dVar1 + 1.0;
    dVar7 = 1.0;
    dVar8 = 0.0;
    bfrac::p = 1.0;
    bfrac::an = 1.0;
    dVar5 = dVar10 / dVar3;
    bfrac::bn = dVar3 / dVar10;
    while( true ) {
      dVar4 = dVar4 + 1.0;
      dVar11 = dVar4 / dVar1;
      dVar6 = (*b - dVar4) * dVar4 * *x;
      dVar9 = *x * dVar6 *
              (*b / dVar1 + bfrac::p) * bfrac::p * (dVar1 / bfrac::s) * (dVar1 / bfrac::s);
      bfrac::p = dVar11 + 1.0;
      dVar6 = (dVar4 * (*y + 1.0) + dVar3) * (bfrac::p / (dVar10 + dVar11 + dVar11)) +
              dVar6 / bfrac::s + dVar4;
      bfrac::anp1 = dVar8 * dVar9 + dVar6 * bfrac::an;
      bfrac::bnp1 = dVar9 * dVar7 + dVar6 * bfrac::bn;
      bfrac::r = bfrac::anp1 / bfrac::bnp1;
      bfrac::s = bfrac::s + 2.0;
      if (ABS(bfrac::r - dVar5) <= bfrac::r * *eps) break;
      dVar8 = bfrac::an / bfrac::bnp1;
      dVar7 = bfrac::bn / bfrac::bnp1;
      bfrac::an = bfrac::r;
      dVar5 = bfrac::r;
      bfrac::bn = 1.0;
    }
    dVar2 = dVar2 * bfrac::r;
    bfrac::n = dVar4;
  }
  return dVar2;
}

Assistant:

double bfrac(double *a,double *b,double *x,double *y,double *lambda,
             double *eps)
/*
-----------------------------------------------------------------------
     CONTINUED FRACTION EXPANSION FOR IX(A,B) WHEN A,B .GT. 1.
     IT IS ASSUMED THAT  LAMBDA = (A + B)*Y - B.
-----------------------------------------------------------------------
*/
{
static double bfrac,alpha,an,anp1,beta,bn,bnp1,c,c0,c1,e,n,p,r,r0,s,t,w,yp1;
/*
     ..
     .. Executable Statements ..
*/
    bfrac = brcomp(a,b,x,y);
    if(bfrac == 0.0e0) return bfrac;
    c = 1.0e0+*lambda;
    c0 = *b/ *a;
    c1 = 1.0e0+1.0e0/ *a;
    yp1 = *y+1.0e0;
    n = 0.0e0;
    p = 1.0e0;
    s = *a+1.0e0;
    an = 0.0e0;
    bn = anp1 = 1.0e0;
    bnp1 = c/c1;
    r = c1/c;
S10:
/*
        CONTINUED FRACTION CALCULATION
*/
    n += 1.0e0;
    t = n/ *a;
    w = n*(*b-n)**x;
    e = *a/s;
    alpha = p*(p+c0)*e*e*(w**x);
    e = (1.0e0+t)/(c1+t+t);
    beta = n+w/s+e*(c+n*yp1);
    p = 1.0e0+t;
    s += 2.0e0;
/*
        UPDATE AN, BN, ANP1, AND BNP1
*/
    t = alpha*an+beta*anp1;
    an = anp1;
    anp1 = t;
    t = alpha*bn+beta*bnp1;
    bn = bnp1;
    bnp1 = t;
    r0 = r;
    r = anp1/bnp1;
    if(fabs(r-r0) <= *eps*r) goto S20;
/*
        RESCALE AN, BN, ANP1, AND BNP1
*/
    an /= bnp1;
    bn /= bnp1;
    anp1 = r;
    bnp1 = 1.0e0;
    goto S10;
S20:
/*
                 TERMINATION
*/
    bfrac *= r;
    return bfrac;
}